

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

SDL_AudioStatus SDL_GetAudioStatus(void)

{
  int iVar1;
  SDL_AudioStatus SVar2;
  
  (*SDL20_LockAudio)();
  SVar2 = SDL_AUDIO_STOPPED;
  if ((audio_cbdata != (AudioCallbackWrapperData *)0x0) &&
     (SVar2 = SDL_AUDIO_STOPPED, audio_cbdata->app_callback_opened != SDL_FALSE)) {
    iVar1 = (*SDL20_AtomicGet)(&audio_callback_paused);
    SVar2 = SDL_AUDIO_PAUSED - (iVar1 == 0);
  }
  (*SDL20_UnlockAudio)();
  return SVar2;
}

Assistant:

SDLCALL
SDL_GetAudioStatus(void)
{
    SDL_AudioStatus retval = SDL_AUDIO_STOPPED;
    SDL20_LockAudio();
    if (audio_cbdata && audio_cbdata->app_callback_opened) {
        retval = SDL20_AtomicGet(&audio_callback_paused) ? SDL_AUDIO_PAUSED : SDL_AUDIO_PLAYING;
    }
    SDL20_UnlockAudio();
    return retval;
}